

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O1

void __thiscall Exttpose::tpose(Exttpose *this)

{
  pointer pTVar1;
  pointer puVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pcVar7;
  pointer pcVar8;
  bool bVar9;
  char cVar10;
  uint uVar11;
  ostream *poVar12;
  long *plVar13;
  ExttposeArgument *pEVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  runtime_error *prVar18;
  unsigned_long uVar19;
  unsigned_long uVar20;
  DbaseCtrlBlk *pDVar21;
  ulong uVar22;
  int iVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  Exttpose *pEVar28;
  vector<TransArray,_std::allocator<TransArray>_> *pvVar29;
  int iVar30;
  ostringstream *poVar31;
  double dVar32;
  int numitem;
  int custid;
  int tid;
  int *buf;
  long extarysz;
  int l2cnt;
  int null;
  string tmpiset;
  ofstream ofd;
  int file_offset;
  string tmpnam;
  ostringstream tmpnamestrm;
  int local_8b4;
  uint local_8b0;
  int local_8ac;
  int *local_8a8;
  Exttpose *local_8a0;
  ulong local_898;
  DbaseCtrlBlk *local_890;
  undefined8 local_888;
  ulong local_880;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_878;
  long local_870;
  ulong local_868;
  ulong local_860;
  vector<int,_std::allocator<int>_> *local_858;
  vector<char,_std::allocator<char>_> *local_850;
  uint local_844;
  vector<TransArray,_std::allocator<TransArray>_> *local_840;
  undefined1 *local_838 [2];
  undefined1 local_828 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  vector<int,_std::allocator<int>_> *local_7f8;
  long local_7f0;
  undefined1 *local_7e8;
  undefined8 local_7e0;
  undefined1 local_7d8 [16];
  long local_7c8;
  filebuf local_7c0 [24];
  byte abStack_7a8 [216];
  ios_base local_6d0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_7c8);
  pDVar21 = &this->dcb;
  local_8a0 = this;
  DbaseCtrlBlk::get_first_blk(pDVar21);
  DbaseCtrlBlk::get_next_trans(pDVar21,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
  local_880 = (ulong)local_8b0;
  while (pEVar28 = local_8a0, (local_8a0->dcb).readall != '\x01') {
    if (0 < local_8b4) {
      piVar4 = (local_8a0->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pEVar14 = local_8a0->args;
      piVar5 = (local_8a0->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (local_8a0->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar25 = 0;
      do {
        piVar15 = piVar4 + local_8a8[lVar25];
        *piVar15 = *piVar15 + 1;
        if ((pEVar14->use_seq != 0) && (piVar6[local_8a8[lVar25]] != local_8b0)) {
          piVar15 = piVar5 + local_8a8[lVar25];
          *piVar15 = *piVar15 + 1;
          piVar6[local_8a8[lVar25]] = local_8b0;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < local_8b4);
    }
    DbaseCtrlBlk::get_next_trans(pDVar21,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
  }
  local_898 = (ulong)local_8b0;
  poVar31 = &local_8a0->env->logger;
  local_890 = pDVar21;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"MINMAX ",7);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)local_880);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,(int)local_898);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  pEVar14 = pEVar28->args;
  if (pEVar14->DBASE_MAXITEM < 1) {
    iVar23 = 0;
    iVar30 = 0;
  }
  else {
    lVar25 = 0;
    iVar30 = 0;
    iVar23 = 0;
    do {
      if (pEVar14->use_seq == 0) {
        piVar4 = (local_8a0->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)piVar4[lVar25] < pEVar14->MINSUPPORT) goto LAB_00109d9f;
        uVar19 = local_8a0->numfreq;
        (local_8a0->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = (int)uVar19;
        local_8a0->numfreq = uVar19 + 1;
        iVar3 = piVar4[lVar25];
        iVar30 = iVar30 + iVar3;
        iVar23 = (iVar23 - iVar3) + pEVar14->DBASE_NUM_TRANS;
      }
      else if ((long)(local_8a0->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25] < pEVar14->MINSUPPORT) {
LAB_00109d9f:
        (local_8a0->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = -1;
      }
      else {
        poVar12 = (ostream *)
                  std::ostream::operator<<((ostream *)&local_8a0->env->logger,(int)lVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," SUPP ",6);
        plVar13 = (long *)std::ostream::operator<<
                                    ((ostream *)poVar12,
                                     (local_8a0->itcnt).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar25]);
        std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
        std::ostream::put((char)plVar13);
        std::ostream::flush();
        uVar19 = local_8a0->numfreq;
        (local_8a0->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = (int)uVar19;
        local_8a0->numfreq = uVar19 + 1;
      }
      lVar25 = lVar25 + 1;
      pEVar14 = local_8a0->args;
    } while (lVar25 < pEVar14->DBASE_MAXITEM);
  }
  pEVar28 = local_8a0;
  std::vector<int,_std::allocator<int>_>::resize(&local_8a0->backidx,local_8a0->numfreq);
  pEVar28->numfreq = 0;
  pEVar14 = pEVar28->args;
  if (0 < pEVar14->DBASE_MAXITEM) {
    piVar4 = (pEVar28->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (pEVar28->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar25 = 0;
    uVar19 = pEVar28->numfreq;
    do {
      if (pEVar14->use_seq == 0) {
        iVar3 = piVar6[lVar25];
      }
      else {
        iVar3 = piVar4[lVar25];
      }
      uVar20 = uVar19;
      if (pEVar14->MINSUPPORT <= (long)iVar3) {
        uVar20 = uVar19 + 1;
        pEVar28->numfreq = uVar20;
        piVar5[uVar19] = (int)lVar25;
      }
      lVar25 = lVar25 + 1;
      uVar19 = uVar20;
    } while (lVar25 < pEVar14->DBASE_MAXITEM);
  }
  poVar31 = &pEVar28->env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"numfreq ",8);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar31);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," :  ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," SUMSUP SUMDIFF = ",0x12);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  plVar13 = (long *)std::ostream::operator<<((ostream *)poVar12,iVar23);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  poVar31 = &pEVar28->env->summary;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," F1stats = [ ",0xd);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar31);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ]",2);
  if (pEVar28->numfreq != 0) {
    local_888 = 4;
    local_870 = (long)((ulong)pEVar28->args->AMEM / pEVar28->numfreq) / 4;
    poVar31 = &pEVar28->env->logger;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"EXTRARYSZ ",10);
    poVar12 = std::ostream::_M_insert<long>((long)poVar31);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if (local_870 < 2) {
      local_870 = 2;
    }
    pvVar29 = &pEVar28->extary;
    std::vector<TransArray,_std::allocator<TransArray>_>::reserve(pvVar29,pEVar28->numfreq);
    if (pEVar28->numfreq != 0) {
      uVar22 = 0;
      do {
        std::vector<TransArray,std::allocator<TransArray>>::emplace_back<long&,int&>
                  ((vector<TransArray,std::allocator<TransArray>> *)pvVar29,&local_870,
                   &pEVar28->args->num_partitions);
        uVar22 = uVar22 + 1;
      } while (uVar22 < pEVar28->numfreq);
    }
    local_840 = pvVar29;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    pEVar14 = pEVar28->args;
    iVar23 = pEVar14->num_partitions;
    dVar32 = ceil((double)(((int)local_898 - (int)local_880) + 1) / (double)iVar23);
    local_868 = (ulong)(uint)(int)dVar32;
    if (pEVar14->do_invert != 0) {
      if (1 < iVar23) {
        DbaseCtrlBlk::get_first_blk(local_890);
        DbaseCtrlBlk::get_next_trans(local_890,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
      }
      pEVar14 = pEVar28->args;
      if (0 < pEVar14->num_partitions) {
        local_850 = (vector<char,_std::allocator<char>_> *)
                    CONCAT44(local_850._4_4_,(int)local_880 + (int)local_868);
        local_878 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(local_878._4_4_,(int)local_898 + 1);
        lVar25 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pEVar14->idxfn)._M_dataplus._M_p,
                     (pEVar14->idxfn)._M_string_length);
          pDVar21 = local_890;
          if (1 < pEVar28->args->num_partitions) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".P",2);
            std::ostream::operator<<((ostream *)local_1a8,(int)lVar25);
            iVar23 = (int)lVar25 * (int)local_868 + (int)local_850;
            if ((int)local_898 < iVar23) {
              iVar23 = (int)local_878;
            }
            piVar4 = (pEVar28->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = (pEVar28->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar4 != piVar5) {
              memset(piVar4,0,((long)piVar5 + (-4 - (long)piVar4) & 0xfffffffffffffffcU) + 4);
            }
            piVar4 = (pEVar28->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = (pEVar28->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar4 != piVar5) {
              memset(piVar4,0xff,((long)piVar5 + (-4 - (long)piVar4) & 0xfffffffffffffffcU) + 4);
            }
            piVar4 = (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar5 = (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar4 != piVar5) {
              memset(piVar4,0,((long)piVar5 + (-4 - (long)piVar4) & 0xfffffffffffffffcU) + 4);
            }
            while (((pEVar28->dcb).readall != '\x01' && ((int)local_8b0 < iVar23))) {
              if (0 < local_8b4) {
                piVar4 = (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pEVar14 = pEVar28->args;
                piVar5 = (pEVar28->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar6 = (pEVar28->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar26 = 0;
                do {
                  piVar15 = piVar4 + local_8a8[lVar26];
                  *piVar15 = *piVar15 + 1;
                  if ((pEVar14->use_seq != 0) && (piVar6[local_8a8[lVar26]] != local_8b0)) {
                    piVar15 = piVar5 + local_8a8[lVar26];
                    *piVar15 = *piVar15 + 1;
                    piVar6[local_8a8[lVar26]] = local_8b0;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 < local_8b4);
              }
              DbaseCtrlBlk::get_next_trans
                        (pDVar21,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
            }
          }
          std::__cxx11::stringbuf::str();
          poVar31 = &pEVar28->env->logger;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"OPENED ",7);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar31,local_3b8[0]._M_dataplus._M_p,
                               local_3b8[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          std::ofstream::open((string *)&local_7c8,(_Ios_Openmode)local_3b8);
          if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_5c8,"Can\'t open file ",local_3b8);
            std::runtime_error::runtime_error(prVar18,(string *)local_5c8);
            __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_5c8[0]._M_dataplus._M_p._0_4_ = 0;
          local_818._M_dataplus._M_p._0_4_ = 0xffffffff;
          pEVar14 = pEVar28->args;
          if (pEVar14->DBASE_MAXITEM < 1) {
            lVar26 = 0;
          }
          else {
            lVar26 = 0;
            do {
              if ((pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar26] == -1) {
                pbVar24 = local_5c8;
                if (pEVar14->no_minus_off == '\0') {
                  pbVar24 = &local_818;
                }
                std::ostream::write((char *)&local_7c8,(long)pbVar24);
              }
              else {
                std::ostream::write((char *)&local_7c8,(long)local_5c8);
                *(long *)(*(long *)&(pEVar28->extary).
                                    super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(pEVar28->freqidx).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar26]].offset.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data + lVar25 * 8) =
                     (long)(int)local_5c8[0]._M_dataplus._M_p;
                pEVar14 = pEVar28->args;
                if (pEVar14->use_seq == 0) {
                  if (pEVar14->use_diff == '\0') {
                    local_5c8[0]._M_dataplus._M_p._0_4_ =
                         (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar26] +
                         (int)local_5c8[0]._M_dataplus._M_p;
                  }
                  else {
                    local_5c8[0]._M_dataplus._M_p._0_4_ =
                         (pEVar14->DBASE_NUM_TRANS + (int)local_5c8[0]._M_dataplus._M_p) -
                         (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar26];
                  }
                }
                else if (pEVar14->use_newformat == '\0') {
                  local_5c8[0]._M_dataplus._M_p._0_4_ =
                       (int)local_5c8[0]._M_dataplus._M_p +
                       (pEVar28->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26] * 2 +
                       (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26];
                }
                else {
                  local_5c8[0]._M_dataplus._M_p._0_4_ =
                       (int)local_5c8[0]._M_dataplus._M_p +
                       (pEVar28->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26] * 2;
                }
              }
              lVar26 = lVar26 + 1;
              pEVar14 = pEVar28->args;
            } while (lVar26 < pEVar14->DBASE_MAXITEM);
          }
          poVar31 = &pEVar28->env->logger;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"OFF ",4);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)lVar26);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          plVar13 = (long *)std::ostream::operator<<
                                      ((ostream *)poVar12,(int)local_5c8[0]._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          std::ostream::flush();
          std::ostream::write((char *)&local_7c8,(long)local_5c8);
          std::ofstream::close();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
            operator_delete(local_3b8[0]._M_dataplus._M_p);
          }
          lVar25 = lVar25 + 1;
          pEVar14 = local_8a0->args;
          pEVar28 = local_8a0;
        } while (lVar25 < pEVar14->num_partitions);
      }
    }
    poVar31 = &pEVar28->env->logger;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"Wrote Offt ",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar31 + -0x18) + (char)poVar31);
    std::ostream::put((char)poVar31);
    std::ostream::flush();
    local_7f8 = &pEVar28->fidx;
    std::vector<int,_std::allocator<int>_>::resize(local_7f8,pEVar28->numfreq);
    pDVar21 = local_890;
    if (pEVar28->args->do_l2 != 0) {
      std::fstream::fstream(local_3b8);
      std::fstream::fstream(local_5c8);
      pvVar29 = local_840;
      local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
      local_818._M_string_length = 0;
      local_818.field_2._M_local_buf[0] = '\0';
      local_7e8 = local_7d8;
      local_7e0 = 0;
      local_7d8[0] = 0;
      if (pEVar28->args->use_seq != 0) {
        std::__cxx11::string::_M_assign((string *)&local_818);
        std::fstream::open((string *)local_5c8,(_Ios_Openmode)&local_818);
        cVar10 = std::__basic_file<char>::is_open();
        if (cVar10 == '\0') {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar18,"Can\'t open out file");
          goto LAB_0010af14;
        }
      }
      pcVar7 = (pEVar28->args->tmpfn)._M_dataplus._M_p;
      local_838[0] = local_828;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_838,pcVar7,pcVar7 + (pEVar28->args->tmpfn)._M_string_length);
      std::__cxx11::string::append((char *)local_838);
      std::__cxx11::string::operator=((string *)&local_7e8,(string *)local_838);
      if (local_838[0] != local_828) {
        operator_delete(local_838[0]);
      }
      std::fstream::open((string *)local_3b8,(_Ios_Openmode)&local_7e8);
      cVar10 = std::__basic_file<char>::is_open();
      if (cVar10 == '\0') {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar18,"Can\'t open out file");
LAB_0010af14:
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pEVar28->args->use_seq != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&pEVar28->seq2,pEVar28->numfreq * pEVar28->numfreq);
      }
      local_878 = &pEVar28->itcnt2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (local_878,pEVar28->numfreq * (pEVar28->numfreq - 1) >> 1);
      local_850 = &pEVar28->ocust;
      std::vector<char,_std::allocator<char>_>::resize
                (local_850,pEVar28->numfreq * (pEVar28->numfreq - 1) >> 1);
      local_858 = &pEVar28->offsets;
      std::vector<int,_std::allocator<int>_>::resize(local_858,pEVar28->numfreq);
      uVar11 = (uint)pEVar28->numfreq;
      if (0 < (int)uVar11) {
        uVar22 = (ulong)(uVar11 & 0x7fffffff);
        piVar15 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (pEVar28->numfreq - uVar22);
        iVar23 = 0;
        do {
          *piVar15 = iVar23;
          iVar23 = iVar23 + (int)(uVar22 - 1);
          piVar15 = piVar15 + 1;
          bVar9 = 1 < (long)uVar22;
          uVar22 = uVar22 - 1;
        } while (bVar9);
      }
      DbaseCtrlBlk::get_first_blk(pDVar21);
      DbaseCtrlBlk::get_next_trans(pDVar21,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
      while ((pEVar28->dcb).readall != '\x01') {
        local_844 = local_8b0;
        local_860 = 0;
        while (((pEVar28->dcb).readall != '\x01' && (local_844 == local_8b0))) {
          if (0 < local_8b4) {
            uVar22 = 1;
            lVar25 = 4;
            lVar26 = 0;
            do {
              uVar11 = (pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[local_8a8[lVar26]];
              lVar16 = (long)(int)uVar11;
              if (lVar16 != -1) {
                if (pEVar28->args->use_seq == 0) {
                  if (lVar26 + 1 < (long)local_8b4) {
                    iVar23 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar16];
                    local_7f0 = lVar26 * 4;
                    uVar17 = uVar22 & 0xffffffff;
                    lVar16 = lVar25;
                    do {
                      iVar30 = (local_8a0->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [*(int *)((long)local_8a8 + lVar16)];
                      if (iVar30 != -1) {
                        puVar2 = (local_878->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start +
                                 (int)(iVar30 + ~uVar11 + iVar23);
                        *puVar2 = *puVar2 + '\x01';
                        if (*puVar2 == '\0') {
                          std::ostream::write(local_3b8[0].field_2._M_local_buf,
                                              (long)local_8a8 + local_7f0);
                          std::ostream::write(local_3b8[0].field_2._M_local_buf,
                                              (long)local_8a8 + lVar16);
                        }
                      }
                      lVar16 = lVar16 + 4;
                      uVar27 = (int)uVar17 + 1;
                      uVar17 = (ulong)uVar27;
                      pEVar28 = local_8a0;
                      pvVar29 = local_840;
                    } while ((int)uVar27 < local_8b4);
                  }
                }
                else {
                  pTVar1 = (pvVar29->super__Vector_base<TransArray,_std::allocator<TransArray>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar16;
                  if (pTVar1->theSize == 0) {
                    (local_7f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)local_860] = uVar11;
                    local_860 = (ulong)((int)local_860 + 1);
                    piVar15 = *(int **)&(pTVar1->theArray).
                                        super__Vector_base<int,_std::allocator<int>_>;
                    *piVar15 = local_8ac;
                    piVar15[1] = local_8ac;
                    pTVar1->theSize = 2;
                  }
                  else {
                    *(int *)(*(long *)&(pTVar1->theArray).
                                       super__Vector_base<int,_std::allocator<int>_> + 4) =
                         local_8ac;
                  }
                  if (lVar26 + 1 < (long)local_8b4) {
                    iVar23 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar16];
                    uVar17 = uVar22;
                    do {
                      iVar30 = (pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[local_8a8[uVar17]];
                      if (iVar30 != -1) {
                        (local_850->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start[(int)(iVar30 + ~uVar11 + iVar23)] = '\x01';
                      }
                      uVar17 = uVar17 + 1;
                    } while ((int)uVar17 < local_8b4);
                  }
                }
              }
              lVar26 = lVar26 + 1;
              uVar22 = uVar22 + 1;
              lVar25 = lVar25 + 4;
            } while (lVar26 < local_8b4);
          }
          DbaseCtrlBlk::get_next_trans(local_890,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0)
          ;
        }
        if (pEVar28->args->use_seq != 0) {
          process_cust(pEVar28,(int)local_860,(fstream *)local_5c8,(fstream *)local_3b8);
        }
      }
      pcVar8 = (pEVar28->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pEVar28->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar8) {
        (pEVar28->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
      }
      poVar31 = &pEVar28->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"2-IT ",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar31 + -0x18) + (char)poVar31);
      std::ostream::put((char)poVar31);
      std::ostream::flush();
      local_838[0] = (undefined1 *)((ulong)local_838[0] & 0xffffffff00000000);
      if (pEVar28->args->use_seq != 0) {
        std::ofstream::open((string *)&local_7c8,(int)pEVar28->args + 0xa0);
        if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar18,"Can\'t open seq file");
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sort_get_l2(pEVar28,(int *)local_838,(fstream *)local_5c8,(ofstream *)&local_7c8,
                    &pEVar28->seq2,false);
        std::ofstream::close();
        poVar31 = &pEVar28->env->logger;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"SEQ2 cnt ",9);
        iVar23 = (int)local_838[0];
        plVar13 = (long *)std::ostream::operator<<((ostream *)poVar31,(int)local_838[0]);
        std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
        std::ostream::put((char)plVar13);
        std::ostream::flush();
        poVar31 = &pEVar28->env->summary;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," ",1);
        std::ostream::operator<<((ostream *)poVar31,iVar23);
      }
      iVar23 = (int)local_838[0];
      std::ofstream::open((string *)&local_7c8,(int)pEVar28->args + 0x80);
      if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar18,"Can\'t open it2 file");
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sort_get_l2(pEVar28,(int *)local_838,(fstream *)local_3b8,(ofstream *)&local_7c8,local_878,
                  false);
      std::ofstream::close();
      poVar31 = &pEVar28->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"SORT ",5);
      iVar30 = (int)local_838[0];
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)local_838[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  ",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      poVar31 = &pEVar28->env->summary;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," F2stats = [",0xc);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar31,iVar30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ]",2);
      piVar4 = (pEVar28->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pEVar28->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        (pEVar28->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
      puVar2 = (pEVar28->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar28->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar2) {
        (pEVar28->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pEVar28->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar28->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pEVar28->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      if (local_7e8 != local_7d8) {
        operator_delete(local_7e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p != &local_818.field_2) {
        operator_delete(local_818._M_dataplus._M_p);
      }
      std::fstream::~fstream(local_5c8);
      std::fstream::~fstream(local_3b8);
    }
    if (pEVar28->args->do_invert != 0) {
      do_invert_db(pEVar28,(int)local_868,(int)local_880,(int)local_898);
    }
    piVar4 = (pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (pEVar28->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    piVar4 = (pEVar28->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pEVar28->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (pEVar28->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  local_7c8 = _VTT;
  *(undefined8 *)(local_7c0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_7c0);
  std::ios_base::~ios_base(local_6d0);
  return;
}

Assistant:

void Exttpose::tpose() {
    int i, j, l;
    int idx;
    int custid, tid, numitem, fcnt;
    ofstream ofd;
    int sumsup = 0, sumdiff = 0;

    //count 1 items
    int *buf;
    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int mincustid = custid;
    while (!dcb.eof()) {
        //env.logger << custid << " " << tid << " " << numitem;
        for (j = 0; j < numitem; j++) {
            //env.logger << " " << buf[j] << flush;
            itlen[buf[j]]++;
            if (args.use_seq && ocnt[buf[j]] != custid) {
                itcnt[buf[j]]++;
                ocnt[buf[j]] = custid;
            }
            //if (buf[j] == 17) env.logger << " " << tid;
        }
        //env.logger << endl;
        dcb.get_next_trans(buf, numitem, tid, custid);
    }
    //env.logger << endl;
    int maxcustid = static_cast<int>(custid);
    env.logger << "MINMAX " << mincustid << " " << maxcustid << endl;

    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT) {
                env.logger << i << " SUPP " << itcnt[i] << endl;
                freqidx[i] = numfreq;
                numfreq++;
            } else freqidx[i] = static_cast<int>(-1);
        } else {
            if (itlen[i] >= args.MINSUPPORT) {
                freqidx[i] = numfreq;
                numfreq++;
                sumsup += itlen[i];
                sumdiff += (args.DBASE_NUM_TRANS - itlen[i]);
            } else freqidx[i] = static_cast<int>(-1);
        }
        //if (i == 17) env.logger << " 17 SUP " << itlen[17] << endl;
    }

    backidx.resize(numfreq);

    numfreq = 0;
    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        } else {
            if (itlen[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        }
    }

    env.logger << "numfreq " << numfreq << " :  " << " SUMSUP SUMDIFF = " << sumsup << " " << sumdiff << endl;

    env.summary << " F1stats = [ " << numfreq << " " << sumsup << " " << sumdiff << " ]";

    if (numfreq == 0) return;

    long extarysz = args.AMEM / numfreq;
    extarysz /= INT_SIZE;
    env.logger << "EXTRARYSZ " << extarysz << endl;
    if (extarysz < 2) extarysz = 2;

    extary.reserve(numfreq);

    for (i = 0; i < numfreq; i++) {
        extary.emplace_back(extarysz, args.num_partitions);
    }

    ostringstream tmpnamestrm;
    int plb, pub, pblk;
    pblk = static_cast<int>(ceil(((double) (maxcustid - mincustid + 1)) / args.num_partitions));
    if (args.do_invert) {
        if (args.num_partitions > 1) {
            dcb.get_first_blk();
            dcb.get_next_trans(buf, numitem, tid, custid);
        }
        for (j = 0; j < args.num_partitions; j++) {
            //construct offsets for 1-itemsets
            tmpnamestrm << args.idxfn;
            if (args.num_partitions > 1) {
                tmpnamestrm << ".P" << j;
                plb = j * pblk + mincustid;
                pub = plb + pblk;
                if (pub > maxcustid) pub = maxcustid + 1;
                std::fill(itcnt.begin(), itcnt.end(), 0);
                std::fill(ocnt.begin(), ocnt.end(), -1);
                std::fill(itlen.begin(), itlen.end(), 0);

                for (; !dcb.eof() && custid < pub;) {
                    for (i = 0; i < numitem; i++) {
                        itlen[buf[i]]++;
                        if (args.use_seq && ocnt[buf[i]] != custid) {
                            itcnt[buf[i]]++;
                            ocnt[buf[i]] = custid;
                        }
                    }
                    dcb.get_next_trans(buf, numitem, tid, custid);
                }
            }
            string tmpnam = tmpnamestrm.str();
            env.logger << "OPENED " << tmpnam << endl;
            ofd.open(tmpnam, ios::binary);
            if (!ofd) {
                throw runtime_error("Can't open file " + tmpnam);
            }

            int file_offset = 0;
            int null = -1;
            for (i = 0; i < args.DBASE_MAXITEM; i++) {
                //if (i == 17) env.logger << "LIDX " << i << " " << itlen[i] << endl;
                if (freqidx[i] != -1) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                    extary[freqidx[i]].set_offset(file_offset, j);
                    if (args.use_seq) {
                        if (args.use_newformat) file_offset += (2 * itlen[i]);
                        else file_offset += (2 * itcnt[i] + itlen[i]);
                    } else {
                        if (args.use_diff) file_offset += (args.DBASE_NUM_TRANS - itlen[i]);
                        else file_offset += itlen[i];
                    }
                } else if (args.no_minus_off) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                } else ofd.write((char *) &null, INT_SIZE);
                //env.logger << "OFF " << i <<" " << file_offset << endl;
            }
            env.logger << "OFF " << i << " " << file_offset << endl;
            ofd.write((char *) &file_offset, INT_SIZE);
            ofd.close();
        }
    }

    env.logger << "Wrote Offt " << endl;

    fidx.resize(numfreq);

    int ocid = -1;
    if (args.do_l2) {
        fstream isetfd;
        fstream seqfd;
        string tmpseq, tmpiset;

        if (args.use_seq) {
            tmpseq = args.tmpfn;
            seqfd.open(tmpseq, ios::binary | ios::trunc);
            if (!seqfd.is_open()) {
                throw runtime_error("Can't open out file");
            }
        }
        tmpiset = args.tmpfn + "iset";
        isetfd.open(tmpiset, ios::binary | ios::trunc);

        if (!isetfd.is_open()) {
            throw runtime_error("Can't open out file");
        }

        if (args.use_seq) {
            seq2.reserve(numfreq * numfreq);
        }

        itcnt2.resize(numfreq * (numfreq - 1) / 2);
        ocust.resize(numfreq * (numfreq - 1) / 2);
        offsets.resize(numfreq);

        int offt = 0;
        int start = static_cast<int>(numfreq);
        for (i = start - 1; i >= 0; i--) {
            offsets[numfreq - i - 1] = offt;
            offt += i;
        }

        ocid = -1;
        int lit;
        //count 2-itemsets
        dcb.get_first_blk();
        dcb.get_next_trans(buf, numitem, tid, custid);
        while (!dcb.eof()) {
            fcnt = 0;
            ocid = custid;
            while (!dcb.eof() && ocid == custid) {
                for (j = 0; j < numitem; j++) {
                    idx = freqidx[buf[j]];
                    if (idx != -1) {
                        if (args.use_seq) {
                            if (extary[idx].size() == 0) {
                                fidx[fcnt] = idx;
                                fcnt++;
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                extary[idx].setitem(0, tid);
                                extary[idx].setitem(1, tid);
                                extary[idx].setsize(2);
                            } else {
                                extary[idx].setitem(1, tid);
                            }

                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    ocust[lit + freqidx[buf[l]]] = 1;
                                }
                            }
                        } else {
                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    if ((++itcnt2[lit + freqidx[buf[l]]]) == 0) {
                                        isetfd.write((char *) &buf[j], INT_SIZE);
                                        isetfd.write((char *) &buf[l], INT_SIZE);
                                    }
                                }
                            }
                        }
                    }
                }
                dcb.get_next_trans(buf, numitem, tid, custid);
            }

            if (args.use_seq) {
                process_cust(fcnt, seqfd, isetfd);
            }
        }
        ocust.clear();
        env.logger << "2-IT " << " " << endl;

        //write 2-itemsets counts to file
        int l2cnt = 0;
        if (args.use_seq) {
            ofd.open(args.seqfn, ios::binary);
            if (ofd.fail()) {
                throw runtime_error("Can't open seq file");
            }
            sort_get_l2(l2cnt, seqfd, ofd, seq2, true);

            ofd.close();
            env.logger << "SEQ2 cnt " << l2cnt << endl;
            env.summary << " " << l2cnt;
        }
        int seqs = l2cnt;

        ofd.open(args.it2fn, ios::binary);
        //if ((fd = open(args.it2fn, (O_WRONLY|O_CREAT|O_TRUNC|O_BINARY), 0666)) < 0){
        if (ofd.fail()) {
            throw runtime_error("Can't open it2 file");
        }
        sort_get_l2(l2cnt, isetfd, ofd, itcnt2, false);
        ofd.close();
        env.logger << "SORT " << l2cnt << "  " << endl;

        env.summary << " F2stats = [" << l2cnt << " " << seqs << " ]";
        offsets.clear();
        itcnt2.clear();
        seq2.clear();
    }

    if (args.do_invert) {
        do_invert_db(pblk, mincustid, maxcustid);
    }

    freqidx.clear();
    backidx.clear();
}